

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSocket.cc
# Opt level: O2

ssize_t __thiscall ClientSocket::write(ClientSocket *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  runtime_error *this_00;
  int *piVar2;
  char *pcVar3;
  undefined4 in_register_00000034;
  allocator local_39;
  string local_38 [32];
  
  sVar1 = send(this->_fileDescriptor,*(void **)CONCAT44(in_register_00000034,__fd),
               ((undefined8 *)CONCAT44(in_register_00000034,__fd))[1],0);
  if (sVar1 != -1) {
    return sVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  std::__cxx11::string::string(local_38,pcVar3,&local_39);
  std::runtime_error::runtime_error(this_00,local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ClientSocket::write( const std::string& data )
{
  auto result = send( _fileDescriptor,
                      reinterpret_cast<const void*>( data.c_str() ),
                      data.size(),
                      0 );

  if( result == -1 )
    throw std::runtime_error( std::string( strerror( errno ) ) );
}